

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O2

string * __thiscall
Jupiter::Socket::ntop6_abi_cxx11_(string *__return_storage_ptr__,Socket *this,in6_addr ip)

{
  char *pcVar1;
  allocator<char> local_19;
  in6_addr ip_local;
  
  ip_local.__in6_u._8_8_ = ip.__in6_u._0_8_;
  ip_local.__in6_u._0_8_ = this;
  pcVar1 = inet_ntop(10,&ip_local,ntop6::buf,0x2e);
  if (pcVar1 == (char *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,ntop6::buf,&local_19);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Jupiter::Socket::ntop6(in_addr6 ip) {
	static char buf[46];
	if (inet_ntop(AF_INET6, &ip, buf, sizeof(buf)) == nullptr) {
		return {};
	}
	return std::string(buf);
}